

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O2

bool __thiscall GameTitle::displayAnimation(GameTitle *this,Screen *screen)

{
  uint uVar1;
  int in_ECX;
  int color;
  int color_00;
  int color1;
  Screen *screen_00;
  GameTitle *this_00;
  
  Screen::startAnimation(screen);
  curs_set(0);
  Screen::createColor(screen,4,0);
  Screen::createColor(screen,3,3);
  uVar1 = Screen::createColor(screen,7,4);
  Screen::createColor(screen,7,0);
  Screen::createColor(screen,4,7);
  Screen::clearScreen(screen);
  uVar1 = (uVar1 & 0xff) << 8;
  Screen::turnAttrOn(screen,uVar1);
  Screen::turnAttrOn(screen,0x200000);
  moveInText(this,screen,color);
  Screen::turnAttrOff(screen,0x200000);
  Screen::turnAttrOff(screen,uVar1);
  Screen::turnAttrOn(screen,uVar1);
  drawBorder(this,screen,color_00);
  screen_00 = (Screen *)(ulong)uVar1;
  this_00 = (GameTitle *)screen;
  Screen::turnAttrOff(screen,uVar1);
  wipeTitle(this_00,screen_00,color1,in_ECX);
  curs_set(1);
  Screen::endAnimation(screen);
  return true;
}

Assistant:

bool GameTitle::displayAnimation(Screen &screen) {
    int colors[5];

    // Start the animation
    screen.startAnimation();

    curs_set(0);

    // Set up the colors of the animation
    colors[0] = screen.createColor(COLOR_BLUE, COLOR_BLACK);      /* The original text color          */
    colors[1] = screen.createColor(COLOR_YELLOW, COLOR_YELLOW);   /* The original title border color  */
    colors[2] = screen.createColor(COLOR_WHITE, COLOR_BLUE);      /* The final title & border color   */
    colors[3] = screen.createColor(COLOR_WHITE, COLOR_BLACK);     /* The final title & border color   */
    colors[4] = screen.createColor(COLOR_BLUE, COLOR_WHITE);     /* The final title & border color   */

    // Clear the screen
    screen.clearScreen();

    // Move the text from the corners to the middle of the screen
    screen.turnAttrOn(COLOR_PAIR(colors[2]));
    screen.turnAttrOn(A_BOLD);
    moveInText(screen, colors[0]);
    screen.turnAttrOff(A_BOLD);
    screen.turnAttrOff(COLOR_PAIR(colors[2]));

    // Draw the border
    screen.turnAttrOn(COLOR_PAIR(colors[2]));
    drawBorder(screen, colors[3]);
    screen.turnAttrOff(COLOR_PAIR(colors[2]));

    // Wipe the text and border
    wipeTitle(screen, colors[2], colors[1]);

    curs_set(1);

    // End the animation
    screen.endAnimation();

    return true;
}